

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O3

string * __thiscall
jsoncons::jsonpath::detail::
abs_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
to_string_abi_cxx11_(string *__return_storage_ptr__,void *this,int level)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (0 < level) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_replace_aux
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
               (char)level * '\x02');
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(int level) const override
        {
            std::string s;
            if (level > 0)
            {
                s.append("\n");
                s.append(std::size_t(level)*2, ' ');
            }
            s.append("abs function");
            return s;
        }